

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_stream_parser.cc
# Opt level: O1

Status * __thiscall
google::protobuf::util::converter::JsonStreamParser::IncrementRecursionDepth
          (Status *__return_storage_ptr__,JsonStreamParser *this,StringPiece key)

{
  int iVar1;
  StringPiece error_message;
  AlphaNum *in_R8;
  char *local_d0;
  undefined8 local_c8;
  AlphaNum local_a0;
  AlphaNum local_70;
  string local_40;
  
  local_a0.piece_size_ = key.length_;
  local_a0.piece_data_ = key.ptr_;
  iVar1 = this->recursion_depth_;
  this->recursion_depth_ = iVar1 + 1;
  if (iVar1 < this->max_recursion_depth_) {
    Status::Status(__return_storage_ptr__);
  }
  else {
    local_d0 = "Message too deep. Max recursion depth reached for key \'";
    local_c8 = 0x37;
    local_70.piece_data_ = "\'";
    local_70.piece_size_ = 1;
    StrCat_abi_cxx11_(&local_40,(protobuf *)&local_d0,&local_a0,&local_70,in_R8);
    error_message.length_ = local_40._M_string_length;
    error_message.ptr_ = local_40._M_dataplus._M_p;
    if ((long)local_40._M_string_length < 0) {
      StringPiece::LogFatalSizeTooBig(local_40._M_string_length,"size_t to int conversion");
    }
    Status::Status(__return_storage_ptr__,INVALID_ARGUMENT,error_message);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

util::Status JsonStreamParser::IncrementRecursionDepth(
    StringPiece key) const {
  if (++recursion_depth_ > max_recursion_depth_) {
    return Status(
        util::error::INVALID_ARGUMENT,
        StrCat("Message too deep. Max recursion depth reached for key '",
                     key, "'"));
  }
  return util::Status();
}